

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederateManager::getInputByTarget(ValueFederateManager *this,string_view key)

{
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  pVar1;
  shared_handle inps;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> ret;
  shared_handle TIDhandle;
  undefined1 local_a0 [32];
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_80;
  const_iterator local_68;
  shared_handle local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = key._M_str;
  local_38._M_len = key._M_len;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::lock_shared(&local_50,&this->targetIDs);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_a0,&local_38,(allocator<char> *)&local_80);
  pVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
          ::equal_range(&(local_50.data)->_M_t,(key_type *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  if (pVar1.first._M_node._M_node != pVar1.second._M_node._M_node) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)local_a0,&this->inputs);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
              (&local_80,
               (DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)local_a0._0_8_,(InterfaceHandle *)(pVar1.first._M_node._M_node + 2));
    gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
              (&local_68,
               (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
               local_a0._0_8_);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_a0 + 8));
    if ((local_80.offset != local_68.offset) || (local_80.vec != local_68.vec)) goto LAB_001d21e4;
  }
  local_80.ptr = (Input *)invalidIpt;
LAB_001d21e4:
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_50.m_handle_lock);
  return local_80.ptr;
}

Assistant:

const Input& ValueFederateManager::getInputByTarget(std::string_view key) const
{
    auto TIDhandle = targetIDs.lock_shared();
    auto res = TIDhandle->equal_range(std::string(key));
    if (res.first != res.second) {
        auto inps = inputs.lock_shared();
        auto ret = inps->find(res.first->second);
        if (ret != inps->end()) {
            return *ret;
        }
    }
    return invalidIpt;
}